

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void print_node(Abc_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  Flow_Data_t *pFVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  char local_26 [6];
  Abc_Obj_t *pAStack_20;
  char m [6];
  Abc_Obj_t *pNext;
  int i;
  Abc_Obj_t *pObj_local;
  
  local_26[0] = '\0';
  if ((*(uint *)&pObj->field_0x14 >> 4 & 1) != 0) {
    strcat(local_26,"A");
  }
  if ((*(uint *)&pObj->field_0x14 >> 5 & 1) != 0) {
    strcat(local_26,"B");
  }
  if ((*(uint *)&pObj->field_0x14 >> 6 & 1) != 0) {
    strcat(local_26,"C");
  }
  uVar3 = Abc_ObjId(pObj);
  uVar4 = Abc_ObjType(pObj);
  uVar8 = *(uint *)&pObj->field_0x14;
  pVVar1 = pManMR->vTimeEdges;
  uVar5 = Abc_ObjId(pObj);
  uVar5 = Vec_PtrSize(pVVar1 + uVar5);
  pFVar2 = pManMR->pDataArray;
  uVar6 = Abc_ObjId(pObj);
  printf("node %d type=%d lev=%d tedge=%d (%x%s) fanouts {",(ulong)uVar3,(ulong)uVar4,
         (ulong)(uVar8 >> 0xc),(ulong)uVar5,(ulong)*(ushort *)(pFVar2 + uVar6),local_26);
  for (pNext._4_4_ = 0; iVar7 = Abc_ObjFanoutNum(pObj), pNext._4_4_ < iVar7;
      pNext._4_4_ = pNext._4_4_ + 1) {
    pAStack_20 = Abc_ObjFanout(pObj,pNext._4_4_);
    uVar8 = Abc_ObjId(pAStack_20);
    uVar3 = Abc_ObjType(pAStack_20);
    pFVar2 = pManMR->pDataArray;
    uVar4 = Abc_ObjId(pAStack_20);
    printf("%d[%d](%d),",(ulong)uVar8,(ulong)uVar3,(ulong)*(ushort *)(pFVar2 + uVar4));
  }
  printf("} fanins {");
  for (pNext._4_4_ = 0; iVar7 = Abc_ObjFaninNum(pObj), pNext._4_4_ < iVar7;
      pNext._4_4_ = pNext._4_4_ + 1) {
    pAStack_20 = Abc_ObjFanin(pObj,pNext._4_4_);
    uVar8 = Abc_ObjId(pAStack_20);
    uVar3 = Abc_ObjType(pAStack_20);
    pFVar2 = pManMR->pDataArray;
    uVar4 = Abc_ObjId(pAStack_20);
    printf("%d[%d](%d),",(ulong)uVar8,(ulong)uVar3,(ulong)*(ushort *)(pFVar2 + uVar4));
  }
  printf("}\n");
  return;
}

Assistant:

void
print_node(Abc_Obj_t *pObj) {
  int i;
  Abc_Obj_t * pNext;
  char m[6];

  m[0] = 0;
  if (pObj->fMarkA)
    strcat(m, "A");
  if (pObj->fMarkB)
    strcat(m, "B");
  if (pObj->fMarkC)
    strcat(m, "C");

  printf("node %d type=%d lev=%d tedge=%d (%x%s) fanouts {", Abc_ObjId(pObj), Abc_ObjType(pObj),
         pObj->Level, Vec_PtrSize(FTIMEEDGES(pObj)), FDATA(pObj)->mark, m);
  Abc_ObjForEachFanout( pObj, pNext, i )
    printf("%d[%d](%d),", Abc_ObjId(pNext), Abc_ObjType(pNext), FDATA(pNext)->mark);
  printf("} fanins {");
  Abc_ObjForEachFanin( pObj, pNext, i )
    printf("%d[%d](%d),", Abc_ObjId(pNext), Abc_ObjType(pNext), FDATA(pNext)->mark);
  printf("}\n");
}